

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O2

bool __thiscall OIDType::generateInternalData(OIDType *this)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  char *__s;
  ulong uVar7;
  ulong uVar8;
  uint8_t temp [10];
  long tempVal;
  
  lVar4 = std::__cxx11::string::find((char *)&this->_value,0x10e50e);
  if (lVar4 == 0) {
    puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    temp[0] = '+';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->data,temp);
    __s = (this->_value)._M_dataplus._M_p + 5;
    while (*__s != '\0') {
      pcVar5 = strchr(__s,0x2e);
      temp[8] = '\0';
      temp[9] = '\0';
      temp[0] = '\0';
      temp[1] = '\0';
      temp[2] = '\0';
      temp[3] = '\0';
      temp[4] = '\0';
      temp[5] = '\0';
      temp[6] = '\0';
      temp[7] = '\0';
      iVar3 = __isoc99_sscanf(__s,"%ld.",&tempVal);
      lVar4 = tempVal;
      if (iVar3 == 0) goto LAB_00106685;
      sVar6 = recurse_longform(tempVal,temp,10);
      uVar7 = (sVar6 << 0x20) + 0x100000000;
      temp[(int)sVar6] = (uint8_t)(lVar4 % 0x80);
      uVar8 = uVar7 >> 0x20;
      if ((int)(uVar7 >> 0x20) == 0 || (long)uVar7 < 0) {
        uVar8 = 0;
      }
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->data,temp + uVar7);
      }
      if (pcVar5 == (char *)0x0) break;
      __s = pcVar5 + 1;
    }
    (this->super_BER_CONTAINER)._length =
         *(int *)&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
         *(int *)&(this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    bVar2 = true;
  }
  else {
    this->valid = false;
LAB_00106685:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool OIDType::generateInternalData() {
    if(_value.find(".1.3.") != 0) { this->valid = false; return false; }; // Invalid OID

    this->data.clear();
    this->data.push_back(0x2b); // first byte

    char* valuePtr = &_value[5];

    while(*valuePtr != 0){
        bool toBreak = false;
        char* startNum = valuePtr;

        // Find the end of this item (next dot or end of string)
        char* endNum = strchr(startNum, '.');
        if(!endNum) {
            toBreak = true;
        }

        long tempVal;
        uint8_t temp[10] = {0};
        if(sscanf(startNum, "%ld.", &tempVal)){
            int encoded_length = encode_ber_longform_integer(temp, tempVal, 10);

            for(int i = 0; i < encoded_length; i++){
                this->data.push_back(temp[i]);
            }

            if(toBreak) break;
            valuePtr = endNum+1;
        } else {
            return false;
        }
    }

    this->_length = this->data.size();
    return true;
}